

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O1

void __thiscall HttpHeaderBase::buildHeader(HttpHeaderBase *this)

{
  string *psVar1;
  FieldType FVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  Node *pNVar6;
  
  iVar3 = (*this->_vptr_HttpHeaderBase[4])();
  if (iVar3 < 1) {
    (this->mHeaderStr)._M_string_length = 0;
    *(this->mHeaderStr)._M_dataplus._M_p = '\0';
    return;
  }
  if (0 < this->mNumFields) {
    psVar1 = &this->mHeaderStr;
    lVar5 = 0;
    do {
      pNVar6 = ((this->mFieldMappings).mHead)->next;
      if (pNVar6 != (this->mFieldMappings).mTail) {
        FVar2 = this->mFields[lVar5].mType;
        do {
          lVar4 = (**(code **)(*(long *)pNVar6->val + 0x18))(pNVar6->val,FVar2);
          if (lVar4 != 0) break;
          pNVar6 = pNVar6->next;
        } while (pNVar6 != (this->mFieldMappings).mTail);
      }
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->mNumFields);
  }
  std::__cxx11::string::append((char *)&this->mHeaderStr);
  return;
}

Assistant:

void HttpHeaderBase::buildHeader() const
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (buildFirstLine() <= 0)
	{
		mHeaderStr.clear();
		return;
	}
	
	for (int i = 0; i < mNumFields; i++)
	{
		mHeaderStr += getFieldTypeString(mFields[i].mType);
		mHeaderStr += ": ";
		mHeaderStr += mFields[i].mData;
		mHeaderStr += "\r\n";
	}
		mHeaderStr += "\r\n";	
}